

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O0

http_status_line * parse_status_line(http_status_line *__return_storage_ptr__,sub_string *text)

{
  sub_string *psVar1;
  bool bVar2;
  http_version hVar3;
  http_status_code hVar4;
  char *pcVar5;
  char *pcVar6;
  http_parsing_error *phVar7;
  sub_string other;
  http_status_line *result;
  sub_string local_60;
  char local_49;
  char *local_48;
  char *i;
  sub_string local_20;
  sub_string *local_10;
  sub_string *text_local;
  
  local_10 = text;
  http_status_line::http_status_line(__return_storage_ptr__);
  hVar3 = parse_version(local_10);
  psVar1 = local_10;
  __return_storage_ptr__->version = hVar3;
  local_20 = sub_string::literal<2ul>((char (*) [2])0x18b22a);
  bVar2 = sub_string::try_drop_prefix(psVar1,local_20);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    phVar7 = (http_parsing_error *)__cxa_allocate_exception(0x10);
    http_parsing_error::http_parsing_error(phVar7,"invalid status line");
    __cxa_throw(phVar7,&http_parsing_error::typeinfo,http_parsing_error::~http_parsing_error);
  }
  hVar4 = parse_status_code(local_10);
  psVar1 = local_10;
  __return_storage_ptr__->status_code = hVar4;
  _i = sub_string::literal<2ul>((char (*) [2])0x18b22a);
  bVar2 = sub_string::try_drop_prefix(psVar1,_i);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    phVar7 = (http_parsing_error *)__cxa_allocate_exception(0x10);
    http_parsing_error::http_parsing_error(phVar7,"invalid status line");
    __cxa_throw(phVar7,&http_parsing_error::typeinfo,http_parsing_error::~http_parsing_error);
  }
  pcVar5 = sub_string::begin(local_10);
  pcVar6 = sub_string::end(local_10);
  local_49 = '\r';
  pcVar5 = std::find<char_const*,char>(pcVar5,pcVar6,&local_49);
  local_48 = pcVar5;
  pcVar6 = sub_string::end(local_10);
  if (pcVar5 == pcVar6) {
    phVar7 = (http_parsing_error *)__cxa_allocate_exception(0x10);
    http_parsing_error::http_parsing_error(phVar7,"invalid status line");
    __cxa_throw(phVar7,&http_parsing_error::typeinfo,http_parsing_error::~http_parsing_error);
  }
  pcVar5 = sub_string::begin(local_10);
  sub_string::sub_string(&local_60,pcVar5,local_48);
  (__return_storage_ptr__->reason_phrase).begin_ = local_60.begin_;
  (__return_storage_ptr__->reason_phrase).end_ = local_60.end_;
  sub_string::begin(local_10,local_48);
  psVar1 = local_10;
  other = sub_string::literal<3ul>((char (*) [3])0x1873c6);
  bVar2 = sub_string::try_drop_prefix(psVar1,other);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    return __return_storage_ptr__;
  }
  phVar7 = (http_parsing_error *)__cxa_allocate_exception(0x10);
  http_parsing_error::http_parsing_error(phVar7,"invalid status line");
  __cxa_throw(phVar7,&http_parsing_error::typeinfo,http_parsing_error::~http_parsing_error);
}

Assistant:

http_status_line parse_status_line(sub_string& text)
{
    // Status-Line = HTTP-Version SP Status-Code SP Reason-Phrase CRLF
    http_status_line result;

    result.version = parse_version(text);

    if (!text.try_drop_prefix(sub_string::literal(" ")))
        throw http_parsing_error("invalid status line");

    result.status_code = parse_status_code(text);

    if (!text.try_drop_prefix(sub_string::literal(" ")))
        throw http_parsing_error("invalid status line");

    auto i = std::find(text.begin(), text.end(), '\r');
    if (i == text.end())
        throw http_parsing_error("invalid status line");

    result.reason_phrase = sub_string{text.begin(), i};

    text.begin(i);

    if (!text.try_drop_prefix(sub_string::literal("\r\n")))
        throw http_parsing_error("invalid status line");

    return result;
}